

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O1

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData *draw_data)

{
  uint *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImDrawList *pIVar6;
  ImDrawVert *pIVar7;
  ImDrawCmd *pIVar8;
  code *pcVar9;
  long lVar10;
  int fb_width;
  unsigned_short *puVar11;
  int fb_height;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  GLint last_tex_env_mode;
  GLint last_texture;
  GLint last_polygon_mode [2];
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  undefined4 local_70;
  undefined4 local_6c;
  ImDrawData *local_68;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  long local_38;
  
  fb_width = (int)((draw_data->DisplaySize).x * (draw_data->FramebufferScale).x);
  fb_height = (int)((draw_data->DisplaySize).y * (draw_data->FramebufferScale).y);
  if (fb_height != 0 && fb_width != 0) {
    glGetIntegerv(0x8069,&local_6c);
    glGetIntegerv(0xb40,&local_60);
    glGetIntegerv(0xba2,&local_48);
    glGetIntegerv(0xc10,&local_58);
    glGetTexEnviv(0x2300,0x2200,&local_70);
    glPushAttrib(0x7000);
    ImGui_ImplOpenGL2_SetupRenderState(draw_data,fb_width,fb_height);
    if (0 < draw_data->CmdListsCount) {
      fVar2 = (draw_data->DisplayPos).x;
      fVar3 = (draw_data->DisplayPos).y;
      fVar4 = (draw_data->FramebufferScale).x;
      fVar5 = (draw_data->FramebufferScale).y;
      lVar10 = 0;
      local_68 = draw_data;
      do {
        pIVar6 = local_68->CmdLists[lVar10];
        puVar11 = (pIVar6->IdxBuffer).Data;
        pIVar7 = (pIVar6->VtxBuffer).Data;
        local_38 = lVar10;
        glVertexPointer(2,0x1406,0x14,pIVar7);
        glTexCoordPointer(2,0x1406,0x14,&pIVar7->uv);
        glColorPointer(4,0x1401,0x14,&pIVar7->col);
        if (0 < (pIVar6->CmdBuffer).Size) {
          lVar12 = 0;
          lVar10 = 0;
          do {
            pIVar8 = (pIVar6->CmdBuffer).Data;
            puVar1 = (uint *)((long)&pIVar8->ElemCount + lVar12);
            pcVar9 = *(code **)((long)&pIVar8->UserCallback + lVar12);
            if (pcVar9 == (code *)0x0) {
              fVar13 = (*(float *)((long)&(pIVar8->ClipRect).x + lVar12) - fVar2) * fVar4;
              if ((((fVar13 < (float)fb_width) &&
                   (fVar14 = (*(float *)((long)&(pIVar8->ClipRect).y + lVar12) - fVar3) * fVar5,
                   fVar14 < (float)fb_height)) &&
                  (fVar15 = (*(float *)((long)&(pIVar8->ClipRect).z + lVar12) - fVar2) * fVar4,
                  0.0 <= fVar15)) &&
                 (fVar16 = (*(float *)((long)&(pIVar8->ClipRect).w + lVar12) - fVar3) * fVar5,
                 0.0 <= fVar16)) {
                glScissor((int)fVar13,(int)((float)fb_height - fVar16),(int)(fVar15 - fVar13),
                          (int)(fVar16 - fVar14));
                glBindTexture(0xde1,*(undefined4 *)((long)&pIVar8->TextureId + lVar12));
                glDrawElements(4,*(undefined4 *)((long)&pIVar8->ElemCount + lVar12),0x1403,puVar11);
              }
            }
            else if (pcVar9 == (code *)0xffffffffffffffff) {
              ImGui_ImplOpenGL2_SetupRenderState(local_68,fb_width,fb_height);
            }
            else {
              (*pcVar9)(pIVar6,puVar1);
            }
            puVar11 = puVar11 + *puVar1;
            lVar10 = lVar10 + 1;
            lVar12 = lVar12 + 0x38;
          } while (lVar10 < (pIVar6->CmdBuffer).Size);
        }
        lVar10 = local_38 + 1;
      } while (lVar10 < local_68->CmdListsCount);
    }
    glDisableClientState(0x8076);
    glDisableClientState(0x8078);
    glDisableClientState(0x8074);
    glBindTexture(0xde1,local_6c);
    glMatrixMode(0x1700);
    glPopMatrix();
    glMatrixMode(0x1701);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(0x404,local_60);
    glPolygonMode(0x405,local_5c);
    glViewport(local_48,local_44,local_40,local_3c);
    glScissor(local_58,local_54,local_50,local_4c);
    glTexEnvi(0x2300,0x2200,local_70);
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0)
        return;

    // Backup GL state
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_tex_env_mode; glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);

    // Setup desired GL state
    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer);
                }
            }
            idx_buffer += pcmd->ElemCount;
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);
}